

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_aegis128l.cc
# Opt level: O1

int aead_aegis_128l_seal_scatter
              (EVP_AEAD_CTX *ctx,uint8_t *out,uint8_t *out_tag,size_t *out_tag_len,
              size_t max_out_tag_len,uint8_t *nonce,size_t nonce_len,uint8_t *in,size_t in_len,
              uint8_t *extra_in,size_t extra_in_len,uint8_t *ad,size_t ad_len)

{
  undefined1 (*pauVar1) [16];
  byte bVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  size_t sVar7;
  ulong uVar8;
  size_t sVar9;
  size_t __n;
  int line;
  size_t sVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [16];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [16];
  undefined1 auVar22 [64];
  undefined1 auVar23 [16];
  undefined1 auVar24 [64];
  undefined1 auVar25 [16];
  undefined1 auVar26 [64];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [64];
  uint8_t padded_nonce [16];
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  size_t *local_70;
  undefined1 local_48 [16];
  
  bVar2 = ctx->tag_len;
  if (max_out_tag_len < bVar2) {
    iVar4 = 0x67;
    line = 0xdb;
  }
  else {
    if (nonce_len < 0x11) {
      local_c8 = 0;
      uStack_c0 = 0;
      local_70 = out_tag_len;
      if (nonce_len != 0) {
        memcpy(&local_c8,nonce,nonce_len);
      }
      auVar18 = *(undefined1 (*) [16])&ctx->state;
      auVar27 = ZEXT816(0) ^ auVar18;
      auVar16 = ZEXT1664(auVar27);
      auVar24 = ZEXT1664(_DAT_00256080);
      auVar29 = ZEXT1664(_DAT_00256080 ^ auVar18);
      auVar22 = ZEXT1664(_DAT_00256090);
      auVar19 = ZEXT1664(_DAT_00256090 ^ auVar18);
      iVar4 = 10;
      auVar20 = ZEXT1664(_DAT_00256080 ^ auVar18);
      auVar26 = ZEXT1664(_DAT_00256090);
      auVar17 = ZEXT1664(auVar27);
      do {
        auVar14 = aesenc(auVar29._0_16_,auVar17._0_16_);
        auVar27 = aesenc(auVar19._0_16_,auVar29._0_16_);
        auVar29._0_32_ = ZEXT1632(auVar27);
        auVar27 = aesenc(auVar20._0_16_,auVar19._0_16_);
        auVar19._0_32_ = ZEXT1632(auVar27);
        auVar27 = aesenc(auVar16._0_16_,auVar20._0_16_);
        auVar20._0_32_ = ZEXT1632(auVar27);
        auVar27 = aesenc(auVar22._0_16_,auVar16._0_16_);
        auVar21 = aesenc(auVar24._0_16_,auVar22._0_16_);
        auVar22._0_32_ = ZEXT1632(auVar21);
        auVar21 = aesenc(auVar26._0_16_,auVar24._0_16_);
        auVar24._0_32_ = ZEXT1632(auVar21);
        auVar21 = aesenc(auVar17._0_16_,auVar26._0_16_);
        auVar26._0_32_ = ZEXT1632(auVar21);
        auVar17 = ZEXT1664(auVar14 ^ ZEXT816(0));
        auVar16 = ZEXT1664(auVar27 ^ auVar18);
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
      if (ad_len < 0x20) {
        lVar6 = 0;
      }
      else {
        lVar5 = 0;
        do {
          auVar13 = auVar29._0_16_;
          auVar14 = auVar19._0_16_;
          auVar21 = auVar20._0_16_;
          auVar15 = auVar22._0_16_;
          auVar11 = auVar24._0_16_;
          auVar12 = auVar26._0_16_;
          pauVar1 = (undefined1 (*) [16])(ad + lVar5);
          auVar18 = aesenc(auVar14,auVar13);
          auVar29._0_32_ = ZEXT1632(auVar18);
          auVar18 = aesenc(auVar21,auVar14);
          auVar19._0_32_ = ZEXT1632(auVar18);
          auVar18 = aesenc(auVar16._0_16_,auVar21);
          auVar20._0_32_ = ZEXT1632(auVar18);
          auVar18 = aesenc(auVar15,auVar16._0_16_);
          auVar27 = aesenc(auVar11,auVar15);
          auVar22._0_32_ = ZEXT1632(auVar27);
          auVar27 = aesenc(auVar12,auVar11);
          auVar24._0_32_ = ZEXT1632(auVar27);
          auVar27 = aesenc(auVar17._0_16_,auVar12);
          auVar26._0_32_ = ZEXT1632(auVar27);
          lVar3 = lVar5 + 0x10;
          auVar27 = aesenc(auVar13,auVar17._0_16_);
          auVar17 = ZEXT1664(auVar27 ^ *pauVar1);
          auVar16 = ZEXT1664(auVar18 ^ *(undefined1 (*) [16])(ad + lVar3));
          lVar6 = lVar5 + 0x20;
          uVar8 = lVar5 + 0x40;
          lVar5 = lVar6;
        } while (uVar8 <= ad_len);
        auVar18 = vpand_avx(auVar13,auVar14);
        local_88 = auVar11 ^ auVar21 ^ auVar18 ^ *(undefined1 (*) [16])(ad + lVar3);
        auVar18 = vpand_avx(auVar15,auVar11);
        local_98 = auVar18 ^ auVar12 ^ auVar14 ^ *pauVar1;
      }
      uVar8 = ad_len & 0x1f;
      if (uVar8 != 0) {
        memset((void *)((long)&local_c8 + uVar8),0,0x20 - uVar8);
        memcpy(&local_c8,ad + lVar6,uVar8);
      }
      if (in_len < 0x20) {
        sVar10 = 0;
      }
      else {
        sVar7 = 0;
        auVar18 = auVar29._0_16_;
        do {
          auVar27 = *(undefined1 (*) [16])(in + sVar7);
          auVar14 = *(undefined1 (*) [16])(in + sVar7 + 0x10);
          auVar13 = auVar22._0_16_;
          auVar23 = auVar24._0_16_;
          auVar21 = vpand_avx(auVar13,auVar23);
          auVar11 = auVar19._0_16_;
          auVar25 = auVar26._0_16_;
          auVar15 = vpand_avx(auVar11,auVar18);
          auVar12 = auVar20._0_16_;
          *(undefined1 (*) [16])(out + sVar7) = auVar21 ^ auVar25 ^ auVar11 ^ auVar27;
          auVar28 = aesenc(auVar11,auVar18);
          auVar29._0_32_ = ZEXT1632(auVar28);
          auVar21 = aesenc(auVar12,auVar11);
          auVar19._0_32_ = ZEXT1632(auVar21);
          auVar21 = aesenc(auVar16._0_16_,auVar12);
          auVar20._0_32_ = ZEXT1632(auVar21);
          auVar21 = aesenc(auVar13,auVar16._0_16_);
          auVar11 = aesenc(auVar23,auVar13);
          auVar22._0_32_ = ZEXT1632(auVar11);
          auVar11 = aesenc(auVar25,auVar23);
          auVar24._0_32_ = ZEXT1632(auVar11);
          auVar11 = aesenc(auVar17._0_16_,auVar25);
          auVar26._0_32_ = ZEXT1632(auVar11);
          auVar18 = aesenc(auVar18,auVar17._0_16_);
          *(undefined1 (*) [16])(out + sVar7 + 0x10) = auVar23 ^ auVar12 ^ auVar15 ^ auVar14;
          auVar17 = ZEXT1664(auVar18 ^ auVar27);
          auVar16 = ZEXT1664(auVar21 ^ auVar14);
          sVar10 = sVar7 + 0x20;
          uVar8 = sVar7 + 0x40;
          sVar7 = sVar10;
          auVar18 = auVar28;
        } while (uVar8 <= in_len);
      }
      local_c8 = 0;
      uStack_c0 = 0;
      uStack_b8 = 0;
      uStack_b0 = 0;
      sVar9 = in_len - sVar10;
      auVar11 = auVar29._0_16_;
      auVar18 = auVar19._0_16_;
      auVar27 = auVar20._0_16_;
      auVar14 = auVar22._0_16_;
      auVar21 = auVar24._0_16_;
      auVar15 = auVar26._0_16_;
      if (extra_in_len == 0) {
        if (in_len != sVar10) {
          memcpy(&local_c8,in + sVar10,sVar9);
        }
      }
      else {
        __n = 0x20 - sVar9;
        if (extra_in_len <= 0x20 - sVar9) {
          __n = extra_in_len;
        }
        if (in_len != sVar10) {
          memcpy(&local_c8,in + sVar10,sVar9);
        }
        if (sVar9 != 0x20) {
          memcpy((void *)((long)&local_c8 + sVar9),extra_in,__n);
        }
        local_a8 = ZEXT816(0);
        local_48 = ZEXT816(0);
        auVar12 = vpand_avx(auVar21,auVar14);
        local_98 = auVar12 ^ auVar18 ^ auVar15 ^ local_a8;
        auVar12 = vpand_avx(auVar18,auVar11);
        local_88 = auVar12 ^ auVar27 ^ auVar21 ^ local_48;
        if (in_len != sVar10) {
          memcpy(out + sVar10,local_98,0x20);
        }
        auVar12 = aesenc(auVar14,auVar16._0_16_);
        auVar13 = aesenc(auVar11,auVar17._0_16_);
        auVar11 = aesenc(auVar18,auVar11);
        auVar18 = aesenc(auVar27,auVar18);
        auVar19._0_32_ = ZEXT1632(auVar18);
        auVar18 = aesenc(auVar16._0_16_,auVar27);
        auVar20._0_32_ = ZEXT1632(auVar18);
        auVar18 = aesenc(auVar21,auVar14);
        auVar22._0_32_ = ZEXT1632(auVar18);
        auVar18 = aesenc(auVar15,auVar21);
        auVar24._0_32_ = ZEXT1632(auVar18);
        auVar18 = aesenc(auVar17._0_16_,auVar15);
        auVar26._0_32_ = ZEXT1632(auVar18);
        auVar17 = ZEXT1664(auVar13 ^ local_a8);
        auVar16 = ZEXT1664(auVar12 ^ local_48);
        sVar9 = __n;
        if (__n + 0x20 < extra_in_len) {
          do {
            auVar18 = *(undefined1 (*) [16])(extra_in + sVar9);
            auVar27 = *(undefined1 (*) [16])(extra_in + sVar9 + 0x10);
            auVar13 = auVar22._0_16_;
            auVar23 = auVar24._0_16_;
            auVar14 = vpand_avx(auVar13,auVar23);
            auVar15 = auVar19._0_16_;
            auVar25 = auVar26._0_16_;
            auVar21 = vpand_avx(auVar15,auVar11);
            auVar12 = auVar20._0_16_;
            *(undefined1 (*) [16])(out_tag + sVar9) = auVar14 ^ auVar25 ^ auVar15 ^ auVar18;
            auVar28 = aesenc(auVar15,auVar11);
            auVar29._0_32_ = ZEXT1632(auVar28);
            auVar14 = aesenc(auVar12,auVar15);
            auVar19._0_32_ = ZEXT1632(auVar14);
            auVar14 = aesenc(auVar16._0_16_,auVar12);
            auVar20._0_32_ = ZEXT1632(auVar14);
            auVar15 = aesenc(auVar13,auVar16._0_16_);
            auVar14 = aesenc(auVar23,auVar13);
            auVar22._0_32_ = ZEXT1632(auVar14);
            auVar14 = aesenc(auVar25,auVar23);
            auVar24._0_32_ = ZEXT1632(auVar14);
            auVar14 = aesenc(auVar17._0_16_,auVar25);
            auVar26._0_32_ = ZEXT1632(auVar14);
            auVar14 = aesenc(auVar11,auVar17._0_16_);
            *(undefined1 (*) [16])(out_tag + sVar9 + 0x10) = auVar23 ^ auVar12 ^ auVar21 ^ auVar27;
            auVar17 = ZEXT1664(auVar14 ^ auVar18);
            auVar16 = ZEXT1664(auVar15 ^ auVar27);
            __n = sVar9 + 0x20;
            uVar8 = sVar9 + 0x40;
            sVar9 = __n;
            auVar11 = auVar28;
          } while (uVar8 < extra_in_len);
        }
        else {
          auVar29 = ZEXT1664(auVar11);
        }
        if (extra_in_len - __n != 0) {
          local_c8 = 0;
          uStack_c0 = 0;
          uStack_b8 = 0;
          uStack_b0 = 0;
          memcpy(&local_c8,extra_in + __n,extra_in_len - __n);
        }
      }
      auVar18._8_8_ = 0;
      auVar18._0_8_ = in_len + extra_in_len;
      auVar27._8_8_ = 0;
      auVar27._0_8_ = ad_len;
      auVar18 = vpunpcklqdq_avx(auVar27,auVar18);
      auVar18 = vpsllq_avx(auVar18,3);
      auVar18 = auVar24._0_16_ ^ auVar18;
      iVar4 = 7;
      do {
        auVar27 = aesenc(auVar29._0_16_,auVar17._0_16_);
        auVar14 = aesenc(auVar19._0_16_,auVar29._0_16_);
        auVar29._0_32_ = ZEXT1632(auVar14);
        auVar21 = aesenc(auVar20._0_16_,auVar19._0_16_);
        auVar19._0_32_ = ZEXT1632(auVar21);
        auVar15 = aesenc(auVar16._0_16_,auVar20._0_16_);
        auVar20._0_32_ = ZEXT1632(auVar15);
        auVar14 = aesenc(auVar22._0_16_,auVar16._0_16_);
        auVar11 = aesenc(auVar24._0_16_,auVar22._0_16_);
        auVar22._0_32_ = ZEXT1632(auVar11);
        auVar12 = aesenc(auVar26._0_16_,auVar24._0_16_);
        auVar24._0_32_ = ZEXT1632(auVar12);
        auVar13 = aesenc(auVar17._0_16_,auVar26._0_16_);
        auVar26._0_32_ = ZEXT1632(auVar13);
        auVar27 = auVar27 ^ auVar18;
        auVar17 = ZEXT1664(auVar27);
        auVar14 = auVar14 ^ auVar18;
        auVar16 = ZEXT1664(auVar14);
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
      *(undefined1 (*) [16])(out_tag + extra_in_len) =
           auVar27 ^ auVar14 ^ auVar15 ^ auVar21 ^ auVar13 ^ auVar11 ^ auVar12;
      *out_tag_len = bVar2 + extra_in_len;
      return 1;
    }
    iVar4 = 0x79;
    line = 0xdf;
  }
  ERR_put_error(0x1e,0,iVar4,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_aegis128l.cc"
                ,line);
  return 0;
}

Assistant:

static int aead_aegis_128l_seal_scatter(
    const EVP_AEAD_CTX *ctx, uint8_t *out, uint8_t *out_tag,
    size_t *out_tag_len, size_t max_out_tag_len, const uint8_t *nonce,
    size_t nonce_len, const uint8_t *in, size_t in_len, const uint8_t *extra_in,
    size_t extra_in_len, const uint8_t *ad, size_t ad_len) {
  const struct aead_aegis_128l_ctx *aegis_ctx =
      (struct aead_aegis_128l_ctx *)&ctx->state;

  return aegis_128l_seal_scatter(
      aegis_ctx->key, out, out_tag, out_tag_len, max_out_tag_len, nonce,
      nonce_len, in, in_len, extra_in, extra_in_len, ad, ad_len, ctx->tag_len);
}